

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawShaderDrawParametersTests.cpp
# Opt level: O2

void vkt::Draw::anon_unknown_0::addDrawCase(TestCaseGroup *group,TestSpec *testSpec,TestFlags flags)

{
  TestContext *testCtx;
  TestNode *node;
  ostringstream name;
  allocator<char> local_259;
  string local_258;
  string local_238;
  TestSpecBase local_218;
  TestSpecBase local_1e0;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"draw");
  if ((flags & 2) != 0) {
    std::operator<<((ostream *)local_1a8,"_indexed");
  }
  if ((flags & 4) != 0) {
    std::operator<<((ostream *)local_1a8,"_indirect");
  }
  if ((flags & 1) != 0) {
    std::operator<<((ostream *)local_1a8,"_instanced");
  }
  if ((flags & 0x10) != 0) {
    std::operator<<((ostream *)local_1a8,"_first_instance");
  }
  node = (TestNode *)operator_new(0xa8);
  testCtx = (group->super_TestNode).m_testCtx;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"",&local_259);
  FlagsTestSpec::FlagsTestSpec((FlagsTestSpec *)&local_218,testSpec);
  local_218._52_4_ = local_218._52_4_ | flags;
  TestSpecBase::TestSpecBase(&local_1e0,&local_218);
  local_1e0._52_4_ = local_218._52_4_;
  TestCase::TestCase((TestCase *)node,testCtx,&local_238,&local_258);
  node->_vptr_TestNode = (_func_int **)&PTR__InstanceFactory_00bd7b88;
  FlagsTestSpec::FlagsTestSpec((FlagsTestSpec *)(node + 1),(FlagsTestSpec *)&local_1e0);
  tcu::TestNode::addChild(&group->super_TestNode,node);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
               *)&local_1e0);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
               *)&local_218);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return;
}

Assistant:

void addDrawCase (tcu::TestCaseGroup* group, const DrawTest::TestSpec testSpec, const TestFlags flags)
{
	std::ostringstream name;
	name << "draw";

	if (flags & TEST_FLAG_INDEXED)			name << "_indexed";
	if (flags & TEST_FLAG_INDIRECT)			name << "_indirect";
	if (flags & TEST_FLAG_INSTANCED)		name << "_instanced";
	if (flags & TEST_FLAG_FIRST_INSTANCE)	name << "_first_instance";

	group->addChild(new InstanceFactory<DrawTest>(group->getTestContext(), name.str(), "", addFlags(testSpec, flags)));
}